

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O1

void __thiscall ON_PointCloud::Destroy(ON_PointCloud *this)

{
  ON_SimpleArray<bool>::SetCapacity(&this->m_H,0);
  ON_SimpleArray<ON_Color>::SetCapacity(&this->m_C,0);
  ON_SimpleArray<double>::SetCapacity(&this->m_V,0);
  ON_SimpleArray<ON_3dVector>::SetCapacity(&this->m_N,0);
  ON_SimpleArray<ON_3dPoint>::SetCapacity(&(this->m_P).super_ON_SimpleArray<ON_3dPoint>,0);
  this->m_hidden_count = 0;
  this->m_flags = 0;
  ON_BoundingBox::Destroy(&this->m_bbox);
  return;
}

Assistant:

void ON_PointCloud::Destroy()
{
  m_H.Destroy();
  m_C.Destroy();
  m_V.Destroy();
  m_N.Destroy();
  m_P.Destroy();
  m_hidden_count=0;
  m_flags = 0;
  m_bbox.Destroy();
}